

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

const_reference __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::back(InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
       *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference pCVar3;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *this_local;
  
  bVar1 = empty(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,299,
                  "const_reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::back() const [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>]"
                 );
  }
  sVar2 = size(this);
  pCVar3 = at(this,sVar2 - 1);
  return pCVar3;
}

Assistant:

const_reference back() const {
    assert(!empty());
    return at(size() - 1);
  }